

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::JsonUnitTestResultPrinter::PrintJsonUnitTest
               (ostream *stream,UnitTest *unit_test)

{
  bool bVar1;
  int iVar2;
  internal *piVar3;
  TestResult *pTVar4;
  ostream *poVar5;
  TestSuite *pTVar6;
  size_t width;
  TimeInMillis ms;
  TimeInMillis ms_00;
  int local_238;
  allocator<char> local_231;
  int i;
  bool comma;
  allocator<char> local_209;
  string local_208;
  string local_1e8;
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  string local_180;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  undefined1 local_70 [8];
  string kIndent;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string kTestsuites;
  UnitTest *unit_test_local;
  ostream *stream_local;
  
  kTestsuites.field_2._8_8_ = unit_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"testsuites",&local_39);
  std::allocator<char>::~allocator(&local_39);
  Indent_abi_cxx11_((string *)local_70,(internal *)0x2,width);
  std::operator<<(stream,"{\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"tests",&local_91);
  iVar2 = UnitTest::reportable_test_count((UnitTest *)kTestsuites.field_2._8_8_);
  OutputJsonKey(stream,(string *)local_38,&local_90,iVar2,(string *)local_70,true);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"failures",&local_b9);
  iVar2 = UnitTest::failed_test_count((UnitTest *)kTestsuites.field_2._8_8_);
  OutputJsonKey(stream,(string *)local_38,&local_b8,iVar2,(string *)local_70,true);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"disabled",&local_e1);
  iVar2 = UnitTest::reportable_disabled_test_count((UnitTest *)kTestsuites.field_2._8_8_);
  OutputJsonKey(stream,(string *)local_38,&local_e0,iVar2,(string *)local_70,true);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"errors",&local_109);
  OutputJsonKey(stream,(string *)local_38,&local_108,0,(string *)local_70,true);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  if ((FLAGS_gtest_shuffle & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"random_seed",&local_131);
    iVar2 = UnitTest::random_seed((UnitTest *)kTestsuites.field_2._8_8_);
    OutputJsonKey(stream,(string *)local_38,&local_130,iVar2,(string *)local_70,true);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator(&local_131);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"timestamp",&local_159);
  piVar3 = (internal *)UnitTest::start_timestamp((UnitTest *)kTestsuites.field_2._8_8_);
  FormatEpochTimeInMillisAsRFC3339_abi_cxx11_(&local_180,piVar3,ms);
  OutputJsonKey(stream,(string *)local_38,&local_158,&local_180,(string *)local_70,true);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"time",&local_1a1);
  piVar3 = (internal *)UnitTest::elapsed_time((UnitTest *)kTestsuites.field_2._8_8_);
  FormatTimeInMillisAsDuration_abi_cxx11_(&local_1c8,piVar3,ms_00);
  OutputJsonKey(stream,(string *)local_38,&local_1a0,&local_1c8,(string *)local_70,false);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  pTVar4 = UnitTest::ad_hoc_test_result((UnitTest *)kTestsuites.field_2._8_8_);
  TestPropertiesAsJson(&local_1e8,pTVar4,(string *)local_70);
  poVar5 = std::operator<<(stream,(string *)&local_1e8);
  std::operator<<(poVar5,",\n");
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"name",&local_209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&i,"AllTests",&local_231);
  OutputJsonKey(stream,(string *)local_38,&local_208,(string *)&i,(string *)local_70,true);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator(&local_231);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  poVar5 = std::operator<<(stream,(string *)local_70);
  poVar5 = std::operator<<(poVar5,"\"");
  poVar5 = std::operator<<(poVar5,(string *)local_38);
  std::operator<<(poVar5,"\": [\n");
  bVar1 = false;
  for (local_238 = 0;
      iVar2 = UnitTest::total_test_suite_count((UnitTest *)kTestsuites.field_2._8_8_),
      local_238 < iVar2; local_238 = local_238 + 1) {
    pTVar6 = UnitTest::GetTestSuite((UnitTest *)kTestsuites.field_2._8_8_,local_238);
    iVar2 = TestSuite::reportable_test_count(pTVar6);
    if (0 < iVar2) {
      if (bVar1) {
        std::operator<<(stream,",\n");
      }
      else {
        bVar1 = true;
      }
      pTVar6 = UnitTest::GetTestSuite((UnitTest *)kTestsuites.field_2._8_8_,local_238);
      PrintJsonTestSuite(stream,pTVar6);
    }
  }
  pTVar4 = UnitTest::ad_hoc_test_result((UnitTest *)kTestsuites.field_2._8_8_);
  bVar1 = TestResult::Failed(pTVar4);
  if (bVar1) {
    pTVar4 = UnitTest::ad_hoc_test_result((UnitTest *)kTestsuites.field_2._8_8_);
    OutputJsonTestSuiteForTestResult(stream,pTVar4);
  }
  poVar5 = std::operator<<(stream,"\n");
  poVar5 = std::operator<<(poVar5,(string *)local_70);
  poVar5 = std::operator<<(poVar5,"]\n");
  std::operator<<(poVar5,"}\n");
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonUnitTest(std::ostream* stream,
                                                  const UnitTest& unit_test) {
  const std::string kTestsuites = "testsuites";
  const std::string kIndent = Indent(2);
  *stream << "{\n";

  OutputJsonKey(stream, kTestsuites, "tests", unit_test.reportable_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "failures", unit_test.failed_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "disabled",
                unit_test.reportable_disabled_test_count(), kIndent);
  OutputJsonKey(stream, kTestsuites, "errors", 0, kIndent);
  if (GTEST_FLAG_GET(shuffle)) {
    OutputJsonKey(stream, kTestsuites, "random_seed", unit_test.random_seed(),
                  kIndent);
  }
  OutputJsonKey(stream, kTestsuites, "timestamp",
                FormatEpochTimeInMillisAsRFC3339(unit_test.start_timestamp()),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "time",
                FormatTimeInMillisAsDuration(unit_test.elapsed_time()), kIndent,
                false);

  *stream << TestPropertiesAsJson(unit_test.ad_hoc_test_result(), kIndent)
          << ",\n";

  OutputJsonKey(stream, kTestsuites, "name", "AllTests", kIndent);
  *stream << kIndent << "\"" << kTestsuites << "\": [\n";

  bool comma = false;
  for (int i = 0; i < unit_test.total_test_suite_count(); ++i) {
    if (unit_test.GetTestSuite(i)->reportable_test_count() > 0) {
      if (comma) {
        *stream << ",\n";
      } else {
        comma = true;
      }
      PrintJsonTestSuite(stream, *unit_test.GetTestSuite(i));
    }
  }

  // If there was a test failure outside of one of the test suites (like in a
  // test environment) include that in the output.
  if (unit_test.ad_hoc_test_result().Failed()) {
    OutputJsonTestSuiteForTestResult(stream, unit_test.ad_hoc_test_result());
  }

  *stream << "\n" << kIndent << "]\n" << "}\n";
}